

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.c
# Opt level: O0

CallFrame * new_call_frame(void)

{
  CallFrame *pCVar1;
  undefined1 local_58 [8];
  ValueArray constants;
  ValueArray variables;
  CodeBuffer code_buffer;
  CallFrame *call_frame;
  
  pCVar1 = (CallFrame *)malloc(0x50);
  pCVar1->ip = (uint8_t *)0x0;
  code_buff_init((CodeBuffer *)&variables.values);
  (pCVar1->code_buffer).cap = (uint64_t)variables.values;
  (pCVar1->code_buffer).count = code_buffer.cap;
  (pCVar1->code_buffer).code = (uint8_t *)code_buffer.count;
  val_arr_init((ValueArray *)&constants.values);
  (pCVar1->variables).cap = (uint64_t)constants.values;
  (pCVar1->variables).count = variables.cap;
  (pCVar1->variables).values = (CrispyValue *)variables.count;
  val_arr_init((ValueArray *)local_58);
  (pCVar1->constants).cap = (uint64_t)local_58;
  (pCVar1->constants).count = constants.cap;
  (pCVar1->constants).values = (CrispyValue *)constants.count;
  return pCVar1;
}

Assistant:

CallFrame *new_call_frame() {
    CallFrame *call_frame = malloc(sizeof(CallFrame));
    call_frame->ip = NULL;

    CodeBuffer code_buffer;
    code_buff_init(&code_buffer);
    call_frame->code_buffer = code_buffer;

    ValueArray variables;
    val_arr_init(&variables);
    call_frame->variables = variables;

    ValueArray constants;
    val_arr_init(&constants);
    call_frame->constants = constants;

    return call_frame;
}